

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexLookupVerifier.cpp
# Opt level: O3

bool tcu::isGatherOffsetsResultValid
               (Texture2DArrayView *texture,Sampler *sampler,LookupPrecision *prec,Vec3 *coord,
               int componentNdx,IVec2 (*offsets) [4],Vec4 *result)

{
  bool bVar1;
  uint uVar3;
  uint coordZ;
  uint uVar4;
  uint uVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  Vec2 local_38;
  uint uVar2;
  
  if (texture->m_numLevels < 1) {
    uVar5 = 0xffffffff;
  }
  else {
    uVar5 = (texture->m_levels->m_size).m_data[2] - 1;
  }
  fVar8 = coord->m_data[2];
  fVar6 = TexVerifierUtil::computeFloatingPointError(fVar8,(prec->coordBits).m_data[2]);
  fVar7 = floorf((fVar8 - fVar6) + 0.5);
  uVar4 = (uint)fVar7;
  fVar8 = ceilf(fVar8 + fVar6 + 0.5);
  uVar3 = (int)fVar8 - 1;
  coordZ = uVar5;
  if ((int)uVar4 < (int)uVar5) {
    coordZ = uVar4;
  }
  uVar2 = 0;
  if ((int)uVar4 < 0) {
    coordZ = uVar2;
  }
  if ((int)uVar3 < (int)uVar5) {
    uVar5 = uVar3;
  }
  if ((int)uVar3 < 0) {
    uVar5 = 0;
  }
  if ((int)coordZ <= (int)uVar5) {
    do {
      local_38.m_data = *(float (*) [2])coord->m_data;
      bVar1 = isGatherOffsetsResultValid<tcu::LookupPrecision,float>
                        (texture->m_levels,sampler,prec,&local_38,coordZ,componentNdx,offsets,result
                        );
      uVar2 = (uint)bVar1;
      if (bVar1) break;
      coordZ = coordZ + 1;
    } while ((int)coordZ <= (int)uVar5);
  }
  return SUB41(uVar2,0);
}

Assistant:

bool isGatherOffsetsResultValid (const Texture2DArrayView&		texture,
								 const Sampler&					sampler,
								 const LookupPrecision&			prec,
								 const Vec3&					coord,
								 int							componentNdx,
								 const IVec2					(&offsets)[4],
								 const Vec4&					result)
{
	return is2DArrayGatherOffsetsResultValid(texture, sampler, prec, coord, componentNdx, offsets, result);
}